

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

int __thiscall cppforth::Forth::accept(Forth *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint uVar1;
  Cell index;
  int extraout_EAX;
  unsigned_long *puVar2;
  Char *pCVar3;
  uint local_64;
  size_type sStack_60;
  Cell i;
  ulong local_58;
  unsigned_long copySize;
  undefined1 local_40 [8];
  string line;
  ulong uStack_18;
  CAddr buffer;
  size_t bufferSize;
  Forth *this_local;
  
  bufferSize = (size_t)this;
  requireDStackAvailable(this,2,"ACCEPT");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  uStack_18 = (ulong)uVar1;
  pop(this);
  line.field_2._12_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  std::__cxx11::string::string((string *)local_40);
  if (this->readFromSource == FromString) {
    std::ios::clear((int)this + 800 + (int)*(undefined8 *)(*(long *)&this->std_cin + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&this->std_cin,(string *)local_40);
    std::ios::clear((int)this + 800 + (int)*(undefined8 *)(*(long *)&this->std_cin + -0x18));
  }
  else if (this->readFromSource == FromStdCin) {
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x1c6650);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_40);
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x1c6650);
  }
  sStack_60 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  puVar2 = std::min<unsigned_long>(&stack0xffffffffffffffa0,&stack0xffffffffffffffe8);
  local_58 = *puVar2;
  for (local_64 = 0; local_64 < local_58; local_64 = local_64 + 1) {
    index = line.field_2._12_4_ + local_64;
    pCVar3 = (Char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::at((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,(ulong)local_64);
    dataSpaceSet(this,index,*pCVar3);
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,(uint)local_58);
  std::__cxx11::string::~string((string *)local_40);
  return extraout_EAX;
}

Assistant:

void accept() {
			REQUIRE_DSTACK_AVAILABLE(2, "ACCEPT");
			auto bufferSize = SIZE_T(dStack.getTop()); pop();
			auto buffer = CAddr(dStack.getTop());
			std::string line{};
			switch (readFromSource) {
			case FromString:
				std_cin.clear();
				std::getline(std_cin, line);
				std_cin.clear();
				break;
			case FromStdCin:
				std::cin.clear();
				std::getline(std::cin, line);
				std::cin.clear();
				break;
			default:
				break;
			}
				auto copySize = std::min(line.length(), bufferSize);
				for (Cell i = 0; i < copySize; ++i) {
					dataSpaceSet(buffer + i, line.at(i));
				}
				dStack.setTop(static_cast<Cell>(copySize));
		}